

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.h
# Opt level: O3

SmartPointer<GEO::Environment> * __thiscall
GEO::SmartPointer<GEO::Environment>::operator=
          (SmartPointer<GEO::Environment> *this,Environment *ptr)

{
  int *piVar1;
  Environment *pEVar2;
  
  pEVar2 = this->pointer_;
  if (pEVar2 != ptr) {
    if (pEVar2 != (Environment *)0x0) {
      piVar1 = &(pEVar2->super_Counted).nb_refs_;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        (*(pEVar2->super_Counted)._vptr_Counted[1])();
      }
    }
    this->pointer_ = ptr;
    if (ptr != (Environment *)0x0) {
      piVar1 = &(ptr->super_Counted).nb_refs_;
      *piVar1 = *piVar1 + 1;
    }
  }
  return this;
}

Assistant:

SmartPointer<T>& operator= (T* ptr) {
            if(ptr != pointer_) {
                T::unref(pointer_);
                pointer_ = ptr;
                T::ref(pointer_);
            }
            return *this;
        }